

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall
matrix_sparse_row_test_empty_row_Test::TestBody(matrix_sparse_row_test_empty_row_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> row_00;
  char *pcVar4;
  reference_value pdVar5;
  char *regex;
  CSR_Data<double,_int> *matrix;
  AssertHelper local_1d8;
  Message local_1d0;
  int local_1c4;
  exception *gtest_exception;
  ReturnSentinel local_190;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_168;
  DeathTest *gtest_dt;
  double remove_warning;
  Message local_150;
  const_iterator local_148;
  const_iterator local_138;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_4;
  Message local_110;
  iterator local_108;
  iterator local_f8;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  Message local_d0;
  int local_c8;
  index_type local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  int local_a0;
  index_type local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  int local_68;
  index_type local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_40 [8];
  Matrix_Sparse_Row<double,_int> row;
  matrix_sparse_row_test_empty_row_Test *this_local;
  
  matrix = &(this->super_matrix_sparse_row_test).csr_data;
  row.value._M_extent._M_extent_value = (size_t)this;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::vector<int,_std::allocator<int>_>::begin(&matrix->row_offset);
  row_00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      &gtest_ar.message_,1);
  Disa::Matrix_Sparse_Row<double,_int>::Matrix_Sparse_Row
            ((Matrix_Sparse_Row<double,_int> *)local_40,matrix,(index_iterator)row_00._M_current);
  local_64 = Disa::Matrix_Sparse_Row<double,_int>::row_offset
                       ((Matrix_Sparse_Row<double,_int> *)local_40);
  local_68 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_60,"row.row_offset()","2",&local_64,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x152,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_9c = Disa::Matrix_Sparse_Row<double,_int>::size_non_zero
                       ((Matrix_Sparse_Row<double,_int> *)local_40);
  local_a0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_98,"row.size_non_zero()","0",&local_9c,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x153,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_c4 = Disa::Matrix_Sparse_Row<double,_int>::row((Matrix_Sparse_Row<double,_int> *)local_40);
  local_c8 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c0,"row.row()","1",&local_c4,&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x154,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_f8 = Disa::Matrix_Sparse_Row<double,_int>::begin((Matrix_Sparse_Row<double,_int> *)local_40)
  ;
  local_108 = Disa::Matrix_Sparse_Row<double,_int>::end((Matrix_Sparse_Row<double,_int> *)local_40);
  testing::internal::EqHelper::
  Compare<Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>,_Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>,_nullptr>
            ((EqHelper *)local_e8,"row.begin()","row.end()",&local_f8,&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x155,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_138 = Disa::Matrix_Sparse_Row<double,_int>::cbegin
                        ((Matrix_Sparse_Row<double,_int> *)local_40);
  local_148 = Disa::Matrix_Sparse_Row<double,_int>::cend((Matrix_Sparse_Row<double,_int> *)local_40)
  ;
  testing::internal::EqHelper::
  Compare<Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_true>,_Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_true>,_nullptr>
            ((EqHelper *)local_128,"row.cbegin()","row.cend()",&local_138,&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&remove_warning,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x156,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&remove_warning,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&remove_warning);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  gtest_dt = (DeathTest *)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_0011b8a9;
  testing::internal::MakeDeathTestMatcher_abi_cxx11_
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&gtest_dt_ptr,(internal *)".*",regex);
  bVar1 = testing::internal::DeathTest::Create
                    ("remove_warning = row.at(0)",
                     (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&gtest_dt_ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                     ,0x158,&local_168);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)&gtest_dt_ptr);
  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0011b8a9;
  if (local_168 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&gtest_sentinel,local_168);
  iVar2 = (*local_168->_vptr_DeathTest[2])();
  if (iVar2 == 0) {
    iVar2 = (*local_168->_vptr_DeathTest[3])();
    bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
    uVar3 = (*local_168->_vptr_DeathTest[4])(local_168,(ulong)bVar1);
    if ((uVar3 & 1) != 0) goto LAB_0011b86b;
    local_1c4 = 2;
  }
  else {
    if (iVar2 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_190,local_168);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        gtest_exception._4_4_ = 0;
        pdVar5 = Disa::Matrix_Sparse_Row<double,_int>::at
                           ((Matrix_Sparse_Row<double,_int> *)local_40,
                            (index_type *)((long)&gtest_exception + 4));
        gtest_dt = (DeathTest *)*pdVar5;
      }
      (*local_168->_vptr_DeathTest[5])(local_168,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_190);
    }
LAB_0011b86b:
    local_1c4 = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                 *)&gtest_sentinel);
  if (local_1c4 == 0) {
    return;
  }
LAB_0011b8a9:
  testing::Message::Message(&local_1d0);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_1d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
             ,0x158,pcVar4);
  testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
  testing::internal::AssertHelper::~AssertHelper(&local_1d8);
  testing::Message::~Message(&local_1d0);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, empty_row) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 1);

  EXPECT_EQ(row.row_offset(), 2);
  EXPECT_EQ(row.size_non_zero(), 0);
  EXPECT_EQ(row.row(), 1);
  EXPECT_EQ(row.begin(), row.end());
  EXPECT_EQ(row.cbegin(), row.cend());
  double remove_warning = 0;
  EXPECT_DEATH(remove_warning = row.at(0), ".*");
}